

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_buffer_mark(nk_buffer *buffer,nk_buffer_allocation_type type)

{
  nk_size *pnVar1;
  
  if (buffer != (nk_buffer *)0x0) {
    buffer->marker[type].active = 1;
    pnVar1 = &buffer->allocated;
    if (type == NK_BUFFER_BACK) {
      pnVar1 = &buffer->size;
    }
    buffer->marker[type].offset = *pnVar1;
    return;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x1fab,"void nk_buffer_mark(struct nk_buffer *, enum nk_buffer_allocation_type)");
}

Assistant:

NK_API void
nk_buffer_mark(struct nk_buffer *buffer, enum nk_buffer_allocation_type type)
{
    NK_ASSERT(buffer);
    if (!buffer) return;
    buffer->marker[type].active = nk_true;
    if (type == NK_BUFFER_BACK)
        buffer->marker[type].offset = buffer->size;
    else buffer->marker[type].offset = buffer->allocated;
}